

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_panel_bmod.h
# Opt level: O0

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::panel_bmod
          (SparseLUImpl<double,_int> *this,int m,int w,int jcol,int nseg,ScalarVector *dense,
          ScalarVector *tempv,IndexVector *segrep,IndexVector *repfnz,GlobalLU_t *glu)

{
  Scalar SVar1;
  Scalar SVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  int *piVar8;
  Scalar *pSVar9;
  long lVar10;
  long lVar11;
  Scalar *pSVar12;
  Scalar *pSVar13;
  Index IVar14;
  ScalarWithConstIfNotLvalue *pSVar15;
  Index m_00;
  Index n;
  Index d;
  Index lda_00;
  ScalarWithConstIfNotLvalue *pSVar16;
  Index ldb;
  ScalarWithConstIfNotLvalue *C;
  Index ldc;
  Scalar *pSVar17;
  Scalar *pSVar18;
  long lVar19;
  undefined1 local_310 [4];
  int lda_1;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> dense_col_2;
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> repfnz_col_3;
  int irow_2;
  int i_3;
  int irow_1;
  int i_2;
  int off_1;
  int isub_1;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> dense_col_1;
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> repfnz_col_2;
  undefined1 local_248 [8];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> L;
  int offset;
  int ldl;
  undefined1 local_208 [8];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> B;
  triangular_solve_retval<1,_Eigen::TriangularView<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_5U>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>_>
  local_1b8;
  OuterStride<_1> local_188;
  undefined1 local_178 [8];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> A;
  int lda;
  int irow;
  int i_1;
  int i;
  int off;
  int isub;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> dense_col;
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> repfnz_col_1;
  undefined1 local_e0 [4];
  int u_col;
  undefined1 local_d0 [8];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_> U;
  undefined1 local_a0 [4];
  int ldu;
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> repfnz_col;
  int local_70;
  int u_cols;
  int u_rows;
  int PacketSize;
  int k;
  int no_zeros;
  int segsize;
  int luptr;
  int lptr;
  int kfnz;
  int krep;
  int nrow;
  int nsupr;
  int nsupc;
  int fsupc;
  int nextl_col;
  int jj;
  int ksub;
  ScalarVector *dense_local;
  int nseg_local;
  int jcol_local;
  int w_local;
  int m_local;
  SparseLUImpl<double,_int> *this_local;
  
  u_rows = nseg + -1;
  u_cols = 2;
  nextl_col = 0;
  _jj = dense;
  dense_local._0_4_ = nseg;
  dense_local._4_4_ = jcol;
  nseg_local = w;
  jcol_local = m;
  _w_local = this;
  do {
    if ((int)dense_local <= nextl_col) {
      return;
    }
    pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)segrep,
                        (long)u_rows);
    lptr = *pSVar6;
    u_rows = u_rows + -1;
    pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->supno,
                        (long)lptr);
    pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)glu,(long)*pSVar6
                       );
    nsupr = *pSVar6;
    nrow = (lptr - nsupr) + 1;
    pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub,
                        (long)(nsupr + 1));
    iVar5 = *pSVar6;
    pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub,
                        (long)nsupr);
    krep = iVar5 - *pSVar6;
    kfnz = krep - nrow;
    pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlsub,
                        (long)nsupr);
    segsize = *pSVar6;
    local_70 = 0;
    repfnz_col.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride.
    _4_4_ = 0;
    for (fsupc = dense_local._4_4_; fsupc < dense_local._4_4_ + nseg_local; fsupc = fsupc + 1) {
      nsupc = (fsupc - dense_local._4_4_) * jcol_local;
      VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)local_a0,repfnz,(long)nsupc
                 ,(long)jcol_local);
      pSVar7 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::
               operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                           *)local_a0,(long)lptr);
      luptr = *pSVar7;
      if (luptr != -1) {
        k = (lptr - luptr) + 1;
        repfnz_col.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
        super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride
        ._4_4_ = repfnz_col.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                 super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                 m_outerStride._4_4_ + 1;
        piVar8 = std::max<int>(&k,&local_70);
        local_70 = *piVar8;
      }
    }
    if (nrow < 2) {
      for (fsupc = dense_local._4_4_; fsupc < dense_local._4_4_ + nseg_local; fsupc = fsupc + 1) {
        nsupc = (fsupc - dense_local._4_4_) * jcol_local;
        VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)
                   &dense_col_2.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                    .m_outerStride,repfnz,(long)nsupc,(long)jcol_local);
        VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_310,_jj,
                   (long)nsupc,(long)jcol_local);
        pSVar7 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                               *)&dense_col_2.
                                  super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                                  super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                  .
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                  .m_outerStride,(long)lptr);
        luptr = *pSVar7;
        if (luptr != -1) {
          k = (lptr - luptr) + 1;
          pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                              &glu->xlusup,(long)nsupr);
          no_zeros = *pSVar6;
          pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                              &glu->xlusup,(long)(nsupr + 1));
          iVar5 = *pSVar6;
          pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                              &glu->xlusup,(long)nsupr);
          iVar5 = iVar5 - *pSVar6;
          PacketSize = luptr - nsupr;
          if (k == 1) {
            LU_kernel_bmod<1>::
            run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                      (1,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_310,tempv,
                       &glu->lusup,&no_zeros,iVar5,kfnz,&glu->lsub,segsize,PacketSize);
          }
          else if (k == 2) {
            LU_kernel_bmod<2>::
            run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                      (2,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_310,tempv,
                       &glu->lusup,&no_zeros,iVar5,kfnz,&glu->lsub,segsize,PacketSize);
          }
          else if (k == 3) {
            LU_kernel_bmod<3>::
            run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                      (3,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_310,tempv,
                       &glu->lusup,&no_zeros,iVar5,kfnz,&glu->lsub,segsize,PacketSize);
          }
          else {
            LU_kernel_bmod<-1>::
            run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                      (k,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_310,tempv,
                       &glu->lusup,&no_zeros,iVar5,kfnz,&glu->lsub,segsize,PacketSize);
          }
        }
      }
    }
    else {
      U.m_stride.super_Stride<_1,_0>._12_4_ = first_multiple<int>(local_70,2);
      pSVar9 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                         (&tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
      lVar10 = (long)local_70;
      lVar11 = (long)repfnz_col.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                     super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                     .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                     .m_outerStride._4_4_;
      OuterStride<-1>::OuterStride
                ((OuterStride<_1> *)local_e0,(long)(int)U.m_stride.super_Stride<_1,_0>._12_4_);
      Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_Eigen::OuterStride<-1>_>::Map
                ((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_> *)
                 local_d0,pSVar9,lVar10,lVar11,(OuterStride<_1> *)local_e0);
      repfnz_col_1.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride.
      _4_4_ = 0;
      for (fsupc = dense_local._4_4_; fsupc < dense_local._4_4_ + nseg_local; fsupc = fsupc + 1) {
        nsupc = (fsupc - dense_local._4_4_) * jcol_local;
        VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)
                   &dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                    .m_outerStride,repfnz,(long)nsupc,(long)jcol_local);
        VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&off,_jj,(long)nsupc,
                   (long)jcol_local);
        pSVar7 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                               *)&dense_col.
                                  super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                                  super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                  .
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                  .m_outerStride,(long)lptr);
        luptr = *pSVar7;
        if (luptr != -1) {
          k = (lptr - luptr) + 1;
          pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                              &glu->xlusup,(long)nsupr);
          no_zeros = *pSVar6;
          PacketSize = luptr - nsupr;
          i = segsize + PacketSize;
          iVar5 = local_70 - k;
          for (irow = 0; irow < iVar5; irow = irow + 1) {
            pSVar12 = DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_Eigen::OuterStride<-1>_>,_1>
                      ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                                    *)local_d0,(long)irow,
                                   (long)repfnz_col_1.
                                         super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>
                                         .
                                         super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                         .
                                         super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                         .m_outerStride._4_4_);
            *pSVar12 = 0.0;
          }
          for (lda = 0; lda < k; lda = lda + 1) {
            pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                &glu->lsub,(long)i);
            A.m_stride.super_Stride<_1,_0>._12_4_ = *pSVar6;
            pSVar13 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                      ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                                    *)&off,(long)(int)A.m_stride.super_Stride<_1,_0>._12_4_);
            SVar1 = *pSVar13;
            pSVar12 = DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_Eigen::OuterStride<-1>_>,_1>
                      ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                                    *)local_d0,(long)(lda + iVar5),
                                   (long)repfnz_col_1.
                                         super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>
                                         .
                                         super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                         .
                                         super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                         .m_outerStride._4_4_);
            *pSVar12 = SVar1;
            i = i + 1;
          }
          repfnz_col_1.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
          super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
          m_outerStride._4_4_ =
               repfnz_col_1.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
               super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
               m_outerStride._4_4_ + 1;
        }
      }
      pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlusup,
                          (long)nsupr);
      no_zeros = *pSVar6;
      pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlusup,
                          (long)(nsupr + 1));
      iVar5 = *pSVar6;
      pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&glu->xlusup,
                          (long)nsupr);
      A.m_stride.super_Stride<_1,_0>._8_4_ = iVar5 - *pSVar6;
      PacketSize = ((lptr - local_70) + 1) - nsupr;
      no_zeros = A.m_stride.super_Stride<_1,_0>._8_4_ * PacketSize + PacketSize + no_zeros;
      pSVar9 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                         (&(glu->lusup).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
      lVar19 = (long)no_zeros;
      lVar10 = (long)local_70;
      lVar11 = (long)local_70;
      OuterStride<-1>::OuterStride(&local_188,(long)(int)A.m_stride.super_Stride<_1,_0>._8_4_);
      Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Map
                ((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                 local_178,pSVar9 + lVar19,lVar10,lVar11,&local_188);
      MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>>::
      triangularView<5u>((Type *)&B.m_stride.super_Stride<_1,_0>.field_0x8,
                         (MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>>
                          *)local_178);
      TriangularView<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,5u>::
      solve<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,Eigen::OuterStride<_1>>>
                (&local_1b8,
                 (TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,5u>
                  *)&B.m_stride.super_Stride<_1,_0>.field_0x8,
                 (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>_>
                  *)local_d0);
      MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,Eigen::OuterStride<-1>>>::
      operator=((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,Eigen::OuterStride<_1>>>
                 *)local_d0,
                (ReturnByValue<Eigen::internal::triangular_solve_retval<1,_Eigen::TriangularView<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_5U>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>_>_>
                 *)&local_1b8);
      no_zeros = local_70 + no_zeros;
      pSVar9 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                         (&(glu->lusup).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
      lVar19 = (long)no_zeros;
      lVar10 = (long)kfnz;
      lVar11 = (long)local_70;
      OuterStride<-1>::OuterStride
                ((OuterStride<_1> *)&offset,(long)(int)A.m_stride.super_Stride<_1,_0>._8_4_);
      Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Map
                ((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                 local_208,pSVar9 + lVar19,lVar10,lVar11,(OuterStride<_1> *)&offset);
      IVar14 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                         ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)tempv);
      if (IVar14 <= nseg_local * U.m_stride.super_Stride<_1,_0>._12_4_ + kfnz * nseg_local + 1) {
        __assert_fail("tempv.size()>w*ldu + nrow*w + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU_panel_bmod.h"
                      ,0x91,
                      "void Eigen::internal::SparseLUImpl<double, int>::panel_bmod(const Index, const Index, const Index, const Index, ScalarVector &, ScalarVector &, IndexVector &, IndexVector &, GlobalLU_t &) [Scalar = double, Index = int]"
                     );
      }
      L.m_stride.super_Stride<_1,_0>._12_4_ = first_multiple<int>(kfnz,2);
      pSVar15 = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                ::data((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                        *)local_208);
      iVar5 = first_aligned<double,int>(pSVar15,2);
      L.m_stride.super_Stride<_1,_0>._8_4_ = (2 - iVar5) % 2;
      pSVar9 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                         (&tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
      iVar5 = nseg_local * U.m_stride.super_Stride<_1,_0>._12_4_;
      lVar19 = (long)(int)L.m_stride.super_Stride<_1,_0>._8_4_;
      lVar10 = (long)kfnz;
      lVar11 = (long)repfnz_col.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                     super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                     .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                     .m_outerStride._4_4_;
      OuterStride<-1>::OuterStride
                ((OuterStride<_1> *)
                 &repfnz_col_2.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                  super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                  super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                  m_outerStride,(long)(int)L.m_stride.super_Stride<_1,_0>._12_4_);
      Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Map
                ((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                 local_248,pSVar9 + iVar5 + lVar19,lVar10,lVar11,
                 (OuterStride<_1> *)
                 &repfnz_col_2.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                  super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                  super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                  m_outerStride);
      DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
      setZero((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               *)local_248);
      m_00 = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
             ::rows((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                     *)local_248);
      n = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
          ::cols((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  *)local_248);
      d = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
          ::cols((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  *)local_208);
      pSVar15 = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                ::data((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                        *)local_208);
      lda_00 = Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::
               outerStride((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                            *)local_208);
      pSVar16 = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_Eigen::OuterStride<-1>_>,_1>
                ::data((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                        *)local_d0);
      ldb = Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_Eigen::OuterStride<-1>_>::outerStride
                      ((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_> *)
                       local_d0);
      C = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
          ::data((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  *)local_248);
      ldc = Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::outerStride
                      ((Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
                       local_248);
      sparselu_gemm<double,long>(m_00,n,d,pSVar15,lda_00,pSVar16,ldb,C,ldc);
      repfnz_col_1.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride.
      _4_4_ = 0;
      for (fsupc = dense_local._4_4_; fsupc < dense_local._4_4_ + nseg_local; fsupc = fsupc + 1) {
        nsupc = (fsupc - dense_local._4_4_) * jcol_local;
        VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)
                   &dense_col_1.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                    .m_outerStride,repfnz,(long)nsupc,(long)jcol_local);
        VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&off_1,_jj,(long)nsupc
                   ,(long)jcol_local);
        pSVar7 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                               *)&dense_col_1.
                                  super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                                  super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                  .
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                  .m_outerStride,(long)lptr);
        luptr = *pSVar7;
        if (luptr != -1) {
          k = (lptr - luptr) + 1;
          PacketSize = luptr - nsupr;
          iVar5 = local_70 - k;
          i_2 = segsize + PacketSize;
          for (i_3 = 0; i_3 < k; i_3 = i_3 + 1) {
            pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                &glu->lsub,(long)i_2);
            iVar4 = *pSVar6;
            pSVar17 = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_Eigen::OuterStride<-1>_>,_0>
                      ::coeff((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                               *)local_d0,(long)(i_3 + iVar5),
                              (long)repfnz_col_1.
                                    super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                                    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                    .
                                    super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                    .m_outerStride._4_4_);
            SVar2 = *pSVar17;
            pSVar13 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                      ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                                    *)&off_1,(long)iVar4);
            *pSVar13 = SVar2;
            pSVar16 = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_Eigen::OuterStride<-1>_>,_1>
                      ::coeffRef((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                                  *)local_d0,(long)(i_3 + iVar5),
                                 (long)repfnz_col_1.
                                       super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>
                                       .
                                       super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                       .
                                       super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                       .m_outerStride._4_4_);
            *pSVar16 = 0.0;
            i_2 = i_2 + 1;
          }
          for (repfnz_col_3.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
               super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
               m_outerStride._4_4_ = 0;
              repfnz_col_3.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
              super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
              m_outerStride._4_4_ < kfnz;
              repfnz_col_3.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
              super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
              m_outerStride._4_4_ =
                   repfnz_col_3.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                   super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                   super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                   m_outerStride._4_4_ + 1) {
            pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                                &glu->lsub,(long)i_2);
            iVar5 = *pSVar6;
            pSVar18 = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
                      ::coeff((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                               *)local_248,
                              (long)repfnz_col_3.
                                    super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                                    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                    .
                                    super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                    .m_outerStride._4_4_,
                              (long)repfnz_col_1.
                                    super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                                    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                    .
                                    super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                    .m_outerStride._4_4_);
            dVar3 = *pSVar18;
            pSVar13 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                      ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                                    *)&off_1,(long)iVar5);
            *pSVar13 = *pSVar13 - dVar3;
            pSVar15 = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                      ::coeffRef((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                  *)local_248,
                                 (long)repfnz_col_3.
                                       super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>
                                       .
                                       super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                       .
                                       super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                       .m_outerStride._4_4_,
                                 (long)repfnz_col_1.
                                       super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>
                                       .
                                       super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                       .
                                       super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                       .m_outerStride._4_4_);
            *pSVar15 = 0.0;
            i_2 = i_2 + 1;
          }
          repfnz_col_1.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
          super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
          m_outerStride._4_4_ =
               repfnz_col_1.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
               super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
               m_outerStride._4_4_ + 1;
        }
      }
    }
    nextl_col = nextl_col + 1;
  } while( true );
}

Assistant:

void SparseLUImpl<Scalar,Index>::panel_bmod(const Index m, const Index w, const Index jcol, 
                                            const Index nseg, ScalarVector& dense, ScalarVector& tempv,
                                            IndexVector& segrep, IndexVector& repfnz, GlobalLU_t& glu)
{
  
  Index ksub,jj,nextl_col; 
  Index fsupc, nsupc, nsupr, nrow; 
  Index krep, kfnz; 
  Index lptr; // points to the row subscripts of a supernode 
  Index luptr; // ...
  Index segsize,no_zeros ; 
  // For each nonz supernode segment of U[*,j] in topological order
  Index k = nseg - 1; 
  const Index PacketSize = internal::packet_traits<Scalar>::size;
  
  for (ksub = 0; ksub < nseg; ksub++)
  { // For each updating supernode
    /* krep = representative of current k-th supernode
     * fsupc =  first supernodal column
     * nsupc = number of columns in a supernode
     * nsupr = number of rows in a supernode
     */
    krep = segrep(k); k--; 
    fsupc = glu.xsup(glu.supno(krep)); 
    nsupc = krep - fsupc + 1; 
    nsupr = glu.xlsub(fsupc+1) - glu.xlsub(fsupc); 
    nrow = nsupr - nsupc; 
    lptr = glu.xlsub(fsupc); 
    
    // loop over the panel columns to detect the actual number of columns and rows
    Index u_rows = 0;
    Index u_cols = 0;
    for (jj = jcol; jj < jcol + w; jj++)
    {
      nextl_col = (jj-jcol) * m; 
      VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
      
      kfnz = repfnz_col(krep); 
      if ( kfnz == emptyIdxLU ) 
        continue; // skip any zero segment
      
      segsize = krep - kfnz + 1;
      u_cols++;
      u_rows = (std::max)(segsize,u_rows);
    }
    
    if(nsupc >= 2)
    { 
      Index ldu = internal::first_multiple<Index>(u_rows, PacketSize);
      Map<Matrix<Scalar,Dynamic,Dynamic>, Aligned,  OuterStride<> > U(tempv.data(), u_rows, u_cols, OuterStride<>(ldu));
      
      // gather U
      Index u_col = 0;
      for (jj = jcol; jj < jcol + w; jj++)
      {
        nextl_col = (jj-jcol) * m; 
        VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
        VectorBlock<ScalarVector> dense_col(dense, nextl_col, m); // Scatter/gather entire matrix column from/to here
        
        kfnz = repfnz_col(krep); 
        if ( kfnz == emptyIdxLU ) 
          continue; // skip any zero segment
        
        segsize = krep - kfnz + 1;
        luptr = glu.xlusup(fsupc);    
        no_zeros = kfnz - fsupc; 
        
        Index isub = lptr + no_zeros;
        Index off = u_rows-segsize;
        for (Index i = 0; i < off; i++) U(i,u_col) = 0;
        for (Index i = 0; i < segsize; i++)
        {
          Index irow = glu.lsub(isub); 
          U(i+off,u_col) = dense_col(irow); 
          ++isub; 
        }
        u_col++;
      }
      // solve U = A^-1 U
      luptr = glu.xlusup(fsupc);
      Index lda = glu.xlusup(fsupc+1) - glu.xlusup(fsupc);
      no_zeros = (krep - u_rows + 1) - fsupc;
      luptr += lda * no_zeros + no_zeros;
      Map<Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > A(glu.lusup.data()+luptr, u_rows, u_rows, OuterStride<>(lda) );
      U = A.template triangularView<UnitLower>().solve(U);
      
      // update
      luptr += u_rows;
      Map<Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > B(glu.lusup.data()+luptr, nrow, u_rows, OuterStride<>(lda) );
      eigen_assert(tempv.size()>w*ldu + nrow*w + 1);
      
      Index ldl = internal::first_multiple<Index>(nrow, PacketSize);
      Index offset = (PacketSize-internal::first_aligned(B.data(), PacketSize)) % PacketSize;
      Map<Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > L(tempv.data()+w*ldu+offset, nrow, u_cols, OuterStride<>(ldl));
      
      L.setZero();
      internal::sparselu_gemm<Scalar>(L.rows(), L.cols(), B.cols(), B.data(), B.outerStride(), U.data(), U.outerStride(), L.data(), L.outerStride());
      
      // scatter U and L
      u_col = 0;
      for (jj = jcol; jj < jcol + w; jj++)
      {
        nextl_col = (jj-jcol) * m; 
        VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
        VectorBlock<ScalarVector> dense_col(dense, nextl_col, m); // Scatter/gather entire matrix column from/to here
        
        kfnz = repfnz_col(krep); 
        if ( kfnz == emptyIdxLU ) 
          continue; // skip any zero segment
        
        segsize = krep - kfnz + 1;
        no_zeros = kfnz - fsupc; 
        Index isub = lptr + no_zeros;
        
        Index off = u_rows-segsize;
        for (Index i = 0; i < segsize; i++)
        {
          Index irow = glu.lsub(isub++); 
          dense_col(irow) = U.coeff(i+off,u_col);
          U.coeffRef(i+off,u_col) = 0;
        }
        
        // Scatter l into SPA dense[]
        for (Index i = 0; i < nrow; i++)
        {
          Index irow = glu.lsub(isub++); 
          dense_col(irow) -= L.coeff(i,u_col);
          L.coeffRef(i,u_col) = 0;
        }
        u_col++;
      }
    }
    else // level 2 only
    {
      // Sequence through each column in the panel
      for (jj = jcol; jj < jcol + w; jj++)
      {
        nextl_col = (jj-jcol) * m; 
        VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
        VectorBlock<ScalarVector> dense_col(dense, nextl_col, m); // Scatter/gather entire matrix column from/to here
        
        kfnz = repfnz_col(krep); 
        if ( kfnz == emptyIdxLU ) 
          continue; // skip any zero segment
        
        segsize = krep - kfnz + 1;
        luptr = glu.xlusup(fsupc);
        
        Index lda = glu.xlusup(fsupc+1)-glu.xlusup(fsupc);// nsupr
        
        // Perform a trianglar solve and block update, 
        // then scatter the result of sup-col update to dense[]
        no_zeros = kfnz - fsupc; 
              if(segsize==1)  LU_kernel_bmod<1>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros);
        else  if(segsize==2)  LU_kernel_bmod<2>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros);
        else  if(segsize==3)  LU_kernel_bmod<3>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros);
        else                  LU_kernel_bmod<Dynamic>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros); 
      } // End for each column in the panel 
    }
    
  } // End for each updating supernode
}